

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O2

void __thiscall
avro::
NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::printBasicInfo(NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                 *this,ostream *os)

{
  Type TVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  Name *n;
  undefined4 extraout_var;
  uint uVar5;
  
  operator<<(os,(this->super_Node).type_);
  iVar2 = (*(this->super_Node)._vptr_Node[2])(this);
  if ((char)iVar2 != '\0') {
    poVar4 = std::operator<<(os,' ');
    n = concepts::NoAttribute<avro::Name>::get
                  ((NoAttribute<avro::Name> *)&(this->super_Node).field_0xd,0);
    operator<<(poVar4,n);
  }
  std::operator<<(os,'\n');
  uVar3 = (*(this->super_Node)._vptr_Node[4])(this);
  if (uVar3 == 0) {
    uVar3 = (*(this->super_Node)._vptr_Node[7])(this);
  }
  uVar5 = 0;
  if ((int)uVar3 < 1) {
    uVar3 = 0;
    uVar5 = 0;
  }
  for (; TVar1 = (this->super_Node).type_, uVar3 != uVar5; uVar5 = uVar5 + 1) {
    if (TVar1 != AVRO_NUM_TYPES) {
      iVar2 = (*(this->super_Node)._vptr_Node[5])(this,(ulong)uVar5);
      (**(code **)(**(long **)CONCAT44(extraout_var,iVar2) + 0x70))
                (*(long **)CONCAT44(extraout_var,iVar2),os);
    }
  }
  if (5 < (uint)(TVar1 + ~AVRO_NULL)) {
    return;
  }
  poVar4 = std::operator<<(os,"end ");
  poVar4 = operator<<(poVar4,(this->super_Node).type_);
  std::operator<<(poVar4,'\n');
  return;
}

Assistant:

inline void 
NodeImpl<A,B,C,D>::printBasicInfo(std::ostream &os) const
{
    os << type();
    if(hasName()) {
        os << ' ' << nameAttribute_.get();
    }

    if(D::hasAttribute) {
        os << " " << sizeAttribute_.get();
    }
    os << '\n';
    int count = leaves();
    count = count ? count : names();
    for(int i= 0; i < count; ++i) {
        if( C::hasAttribute ) {
            os << "name " << nameAt(i) << '\n';
        }
        if( type() != AVRO_SYMBOLIC && leafAttributes_.hasAttribute) {
            leafAt(i)->printBasicInfo(os);
        }
    }
    if(isCompound(type())) {
        os << "end " << type() << '\n';
    }
}